

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int closeHandleInOpenList(FileHandle **list,FileHandle *handle)

{
  FileHandle *pFVar1;
  PHYSFS_Io *pPVar2;
  PHYSFS_uint8 *pPVar3;
  int iVar4;
  __PHYSFS_FILEHANDLE__ **pp_Var5;
  FileHandle *pFVar6;
  
  pFVar1 = *list;
  if (pFVar1 == (FileHandle *)0x0) {
LAB_00109b79:
    iVar4 = 0;
  }
  else {
    if (pFVar1 == handle) {
      pFVar6 = (FileHandle *)0x0;
    }
    else {
      do {
        pFVar6 = pFVar1;
        pFVar1 = pFVar6->next;
        if (pFVar1 == (__PHYSFS_FILEHANDLE__ *)0x0) goto LAB_00109b79;
      } while (pFVar1 != handle);
    }
    pPVar2 = handle->io;
    pPVar3 = handle->buffer;
    if (handle->forReading == '\0') {
      iVar4 = PHYSFS_flush((PHYSFS_File *)handle);
      if (iVar4 == 0) {
        return -1;
      }
      if ((pPVar2->flush != (_func_int_PHYSFS_Io_ptr *)0x0) &&
         (iVar4 = (*pPVar2->flush)(pPVar2), iVar4 == 0)) {
        return -1;
      }
    }
    (*pPVar2->destroy)(pPVar2);
    if (pPVar3 != (PHYSFS_uint8 *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(pPVar3);
    }
    pp_Var5 = &pFVar6->next;
    if (pFVar6 == (FileHandle *)0x0) {
      pp_Var5 = list;
    }
    *pp_Var5 = handle->next;
    (*__PHYSFS_AllocatorHooks.Free)(handle);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int closeHandleInOpenList(FileHandle **list, FileHandle *handle)
{
    FileHandle *prev = NULL;
    FileHandle *i;

    for (i = *list; i != NULL; i = i->next)
    {
        if (i == handle)  /* handle is in this list? */
        {
            PHYSFS_Io *io = handle->io;
            PHYSFS_uint8 *tmp = handle->buffer;

            /* send our buffer to io... */
            if (!handle->forReading)
            {
                if (!PHYSFS_flush((PHYSFS_File *) handle))
                    return -1;

                /* ...then have io send it to the disk... */
                else if (io->flush && !io->flush(io))
                    return -1;
            } /* if */

            /* ...then close the underlying file. */
            io->destroy(io);

            if (tmp != NULL)  /* free any associated buffer. */
                allocator.Free(tmp);

            if (prev == NULL)
                *list = handle->next;
            else
                prev->next = handle->next;

            allocator.Free(handle);
            return 1;
        } /* if */
        prev = i;
    } /* for */

    return 0;
}